

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_meta_type_list.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  bool local_32;
  bool local_31;
  
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x2a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x2b,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(!is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x3d,"int main()",&local_32,&local_31);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x3e,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x52,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x53,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(!is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x67,"int main()",&local_32,&local_31);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x68,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(!is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x7c,"int main()",&local_32,&local_31);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x7d,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(!is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x91,"int main()",&local_32,&local_31);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x92,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(!is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0xa6,"int main()",&local_32,&local_31);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0xa7,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(!is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0xbb,"int main()",&local_32,&local_31);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0xbc,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0xd0,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0xd1,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(!is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0xe5,"int main()",&local_32,&local_31);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0xe6,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  local_31 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(!is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x107,"int main()",&local_32,&local_31);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A_sorted, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x108,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x11a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x129,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x139,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x149,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x159,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x169,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x179,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x189,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x19a,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x1ab,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x1bc,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x1cc,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x1d8,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x1e4,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x1f0,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x1fc,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x208,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x214,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x220,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x22c,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x238,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  local_32 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(is_same<A, B>::value)","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_meta_type_list.cpp"
             ,0x244,"int main()",(bool *)&std::integral_constant<bool,true>::value,&local_32);
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    // type_list_sort {{{
    
    { // 01 {{{ 

        using A = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 10 {{{

        using A = type_list<
            integral_constant<int, 1>
          , integral_constant<int, 0>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((!is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 012 {{{

        using A = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 021 {{{

        using A = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 2>
          , integral_constant<int, 1>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((!is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 102 {{{

        using A = type_list<
            integral_constant<int, 1>
          , integral_constant<int, 0>
          , integral_constant<int, 2>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((!is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 120 {{{

        using A = type_list<
            integral_constant<int, 1>
          , integral_constant<int, 2>
          , integral_constant<int, 0>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((!is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 201 {{{

        using A = type_list<
            integral_constant<int, 2>
          , integral_constant<int, 0>
          , integral_constant<int, 1>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((!is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 210 {{{

        using A = type_list<
            integral_constant<int, 2>
          , integral_constant<int, 1>
          , integral_constant<int, 0>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((!is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 139 {{{

        using A = type_list<
            integral_constant<int, 1>
          , integral_constant<int, 3>
          , integral_constant<int, 9>
        >;

        using B = type_list<
            integral_constant<int, 1>
          , integral_constant<int, 3>
          , integral_constant<int, 9>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 391 {{{

        using A = type_list<
            integral_constant<int, 3>
          , integral_constant<int, 9>
          , integral_constant<int, 1>
        >;

        using B = type_list<
            integral_constant<int, 1>
          , integral_constant<int, 3>
          , integral_constant<int, 9>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((!is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);

    } // }}}

    { // 9123547806 {{{
        using A = type_list<
            integral_constant<int, 9>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
          , integral_constant<int, 3>
          , integral_constant<int, 5>
          , integral_constant<int, 4>
          , integral_constant<int, 7>
          , integral_constant<int, 8>
          , integral_constant<int, 0>
          , integral_constant<int, 6>
        >;

        using B = type_list<
            integral_constant<int, 0>
          , integral_constant<int, 1>
          , integral_constant<int, 2>
          , integral_constant<int, 3>
          , integral_constant<int, 4>
          , integral_constant<int, 5>
          , integral_constant<int, 6>
          , integral_constant<int, 7>
          , integral_constant<int, 8>
          , integral_constant<int, 9>
        >;

        using A_sorted = type_list_sort<A>::type;

        BOOST_TEST_EQ((!is_same<A, B>::value), true);
        BOOST_TEST_EQ((is_same<A_sorted, B>::value), true);
    } // }}}

    // }}}

    // make_key_value_type_list_from_integer_sequence {{{

    { // 01 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 0, 1>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 0>
          , integral_pair<std::size_t, int, 1, 1>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 10 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 1, 0>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 1>
          , integral_pair<std::size_t, int, 1, 0>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 012 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 0, 1, 2>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 0>
          , integral_pair<std::size_t, int, 1, 1>
          , integral_pair<std::size_t, int, 2, 2>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 021 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 0, 2, 1>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 0>
          , integral_pair<std::size_t, int, 1, 2>
          , integral_pair<std::size_t, int, 2, 1>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 102 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 1, 0, 2>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 1>
          , integral_pair<std::size_t, int, 1, 0>
          , integral_pair<std::size_t, int, 2, 2>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 120 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 1, 2, 0>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 1>
          , integral_pair<std::size_t, int, 1, 2>
          , integral_pair<std::size_t, int, 2, 0>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 201 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 2, 0, 1>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 2>
          , integral_pair<std::size_t, int, 1, 0>
          , integral_pair<std::size_t, int, 2, 1>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 210 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 2, 1, 0>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 2>
          , integral_pair<std::size_t, int, 1, 1>
          , integral_pair<std::size_t, int, 2, 0>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 0123 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 0, 1, 2, 3>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 0>
          , integral_pair<std::size_t, int, 1, 1>
          , integral_pair<std::size_t, int, 2, 2>
          , integral_pair<std::size_t, int, 3, 3>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 3210 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 3, 2, 1, 0>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 3>
          , integral_pair<std::size_t, int, 1, 2>
          , integral_pair<std::size_t, int, 2, 1>
          , integral_pair<std::size_t, int, 3, 0>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 1320 {{{

        using A = make_key_value_type_list_from_integer_sequence<
            integer_sequence<int, 1, 3, 2, 0>
        >::type;

        using B = type_list<
            integral_pair<std::size_t, int, 0, 1>
          , integral_pair<std::size_t, int, 1, 3>
          , integral_pair<std::size_t, int, 2, 2>
          , integral_pair<std::size_t, int, 3, 0>
        >;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    // }}} 

    // make_integer_sequence_inverse_mapping {{{

    { // 01 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 0, 1>
        >::type;

        using B = integer_sequence<std::size_t, 0, 1>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 10 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 1, 0>
        >::type;

        using B = integer_sequence<std::size_t, 1, 0>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 012 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 0, 1, 2>
        >::type;

        using B = integer_sequence<std::size_t, 0, 1, 2>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 021 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 0, 2, 1>
        >::type;

        using B = integer_sequence<std::size_t, 0, 2, 1>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 102 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 1, 0, 2>
        >::type;

        using B = integer_sequence<std::size_t, 1, 0, 2>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 120 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 1, 2, 0>
        >::type;

        using B = integer_sequence<std::size_t, 2, 0, 1>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 201 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 2, 0, 1>
        >::type;

        using B = integer_sequence<std::size_t, 1, 2, 0>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 210 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 2, 1, 0>
        >::type;

        using B = integer_sequence<std::size_t, 2, 1, 0>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 0123 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 0, 1, 2, 3>
        >::type;

        using B = integer_sequence<std::size_t, 0, 1, 2, 3>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 3210 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 3, 2, 1, 0>
        >::type;

        using B = integer_sequence<std::size_t, 3, 2, 1, 0>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    { // 1320 {{{

        using A = make_integer_sequence_inverse_mapping<
            integer_sequence<int, 1, 3, 2, 0>
        >::type;

        using B = integer_sequence<std::size_t, 3, 0, 2, 1>;

        BOOST_TEST_EQ((is_same<A, B>::value), true);

    } // }}}

    // }}}

    return boost::report_errors();
}